

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NDOLoader.cpp
# Opt level: O1

void __thiscall
Assimp::NDOImporter::InternReadFile
          (NDOImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer *ppEVar1;
  pointer *ppVVar2;
  _Rb_tree_color _Var3;
  iterator __position;
  pointer pFVar4;
  iterator __position_00;
  pointer pVVar5;
  pointer pEVar6;
  bool bVar7;
  pointer __src;
  pointer puVar8;
  int8_t *piVar9;
  byte bVar10;
  char cVar11;
  uchar uVar12;
  unsigned_short uVar13;
  unsigned_short uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  undefined4 extraout_var;
  Logger *pLVar18;
  aiNode **ppaVar19;
  aiNode *paVar20;
  aiMesh **__s;
  aiNode *this_00;
  mapped_type *pmVar21;
  aiMesh *paVar22;
  ulong *puVar23;
  aiFace *paVar24;
  uint *puVar25;
  undefined8 uVar26;
  aiVector3D *paVar27;
  runtime_error *this_01;
  Edge *edge;
  pointer paVar28;
  long lVar29;
  ulong uVar30;
  pointer pEVar31;
  mapped_type mVar32;
  aiFace *paVar33;
  size_t __n;
  char *message;
  pointer pOVar34;
  float fVar35;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vertices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_> objects;
  StreamReaderBE reader;
  FaceTable face_table;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_288;
  aiNode **local_268;
  aiMesh *local_260;
  aiFace *local_258;
  aiNode *local_250;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  aiScene *local_228;
  undefined1 local_220 [36];
  uint local_1fc;
  pointer local_1f8;
  aiNode *local_1f0;
  aiVector3D **local_1e8;
  StreamReader<true,_false> local_1e0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined8 uStack_188;
  uint uStack_180;
  undefined4 uStack_17c;
  ios_base local_138 [264];
  
  local_228 = pScene;
  local_1a8._0_8_ = &local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"rb","");
  iVar15 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_1a8._0_8_);
  StreamReader<true,_false>::StreamReader
            (&local_1e0,(IOStream *)CONCAT44(extraout_var,iVar15),false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
  }
  piVar9 = local_1e0.current;
  StreamReader<true,_false>::IncPtr(&local_1e0,9);
  iVar15 = strncmp("nendo ",piVar9,6);
  if (iVar15 != 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8._0_8_ = &local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Not a Nendo file; magic signature missing","");
    std::runtime_error::runtime_error(this_01,(string *)local_1a8);
    *(undefined ***)this_01 = &PTR__runtime_error_007fa260;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar28 = (pointer)(piVar9 + 6);
  iVar15 = strncmp("1.0",(char *)paVar28,3);
  local_260 = (aiMesh *)CONCAT44(local_260._4_4_,iVar15);
  if (iVar15 == 0) {
    pLVar18 = DefaultLogger::get();
    message = "NDO file format is 1.0";
  }
  else {
    iVar15 = strncmp("1.1",(char *)paVar28,3);
    if (iVar15 != 0) {
      iVar15 = strncmp("1.2",(char *)paVar28,3);
      if (iVar15 == 0) {
        pLVar18 = DefaultLogger::get();
        bVar7 = true;
        Logger::info(pLVar18,"NDO file format is 1.2");
      }
      else {
        pLVar18 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[65]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [65])
                    "Unrecognized nendo file format version, continuing happily ... :");
        local_288.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_start = paVar28;
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                   (char **)&local_288);
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar18,(char *)local_220._0_8_);
        if ((pointer)local_220._0_8_ != (pointer)(local_220 + 0x10)) {
          operator_delete((void *)local_220._0_8_,
                          (ulong)((long)&(((string *)local_220._16_8_)->_M_dataplus)._M_p + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar7 = true;
      }
      goto LAB_0047e620;
    }
    pLVar18 = DefaultLogger::get();
    message = "NDO file format is 1.1";
  }
  Logger::info(pLVar18,message);
  bVar7 = false;
LAB_0047e620:
  StreamReader<true,_false>::IncPtr(&local_1e0,2);
  if (bVar7) {
    StreamReader<true,_false>::IncPtr(&local_1e0,2);
  }
  bVar10 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
  std::vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>::vector
            ((vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_> *)
             local_220,(ulong)bVar10,(allocator_type *)local_1a8);
  if (local_220._8_8_ != local_220._0_8_) {
    local_268 = (aiNode **)0x0;
    do {
      cVar11 = StreamReader<true,_false>::Get<signed_char>(&local_1e0);
      if (cVar11 != '\0') {
        pOVar34 = (pointer)(local_220._0_8_ + local_268 * 0x68);
        if (bVar7) {
          uVar16 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar16 = (uint)uVar13;
        }
        piVar9 = local_1e0.current;
        StreamReader<true,_false>::IncPtr(&local_1e0,(ulong)(uVar16 + 0x4c));
        local_1a8._0_8_ = &local_198;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,piVar9,piVar9 + uVar16);
        std::__cxx11::string::operator=((string *)pOVar34,(string *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
        }
        if (bVar7) {
          uVar16 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar16 = (uint)uVar13;
        }
        local_250 = (aiNode *)&pOVar34->edges;
        std::vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>::reserve
                  ((vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_> *)
                   local_250,(ulong)uVar16);
        local_258 = (aiFace *)CONCAT44(local_258._4_4_,uVar16);
        if (uVar16 != 0) {
          iVar15 = 0;
          do {
            uStack_188._0_4_ = 0;
            uStack_188._4_1_ = '\0';
            uStack_188._5_1_ = '\0';
            uStack_188._6_1_ = '\0';
            uStack_188._7_1_ = '\0';
            uStack_180 = 0;
            local_198._M_allocated_capacity = 0;
            local_198._8_4_ = 0;
            local_198._12_4_ = 0;
            local_1a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_1a8._8_8_ = 0;
            __position._M_current =
                 (pOVar34->edges).
                 super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pOVar34->edges).
                super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>::
              _M_realloc_insert<Assimp::NDOImporter::Edge>
                        ((vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                          *)local_250,__position,(Edge *)local_1a8);
            }
            else {
              *(undefined8 *)((__position._M_current)->edge + 7) = 0;
              (__position._M_current)->color[0] = '\0';
              (__position._M_current)->color[1] = '\0';
              (__position._M_current)->color[2] = '\0';
              (__position._M_current)->color[3] = '\0';
              (__position._M_current)->color[4] = '\0';
              (__position._M_current)->color[5] = '\0';
              (__position._M_current)->color[6] = '\0';
              (__position._M_current)->color[7] = '\0';
              (__position._M_current)->edge[4] = 0;
              (__position._M_current)->edge[5] = 0;
              (__position._M_current)->edge[6] = 0;
              (__position._M_current)->edge[7] = 0;
              (__position._M_current)->edge[0] = 0;
              (__position._M_current)->edge[1] = 0;
              (__position._M_current)->edge[2] = 0;
              (__position._M_current)->edge[3] = 0;
              ppEVar1 = &(pOVar34->edges).
                         super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppEVar1 = *ppEVar1 + 1;
            }
            pEVar31 = (pOVar34->edges).
                      super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            lVar29 = -0xb;
            do {
              if (bVar7) {
                uVar16 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
              }
              else {
                uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
                uVar16 = (uint)uVar13;
              }
              pEVar31->edge[lVar29] = uVar16;
              lVar29 = lVar29 + 1;
            } while (lVar29 != -3);
            if ((int)local_260 == 0) {
              uVar16 = 0;
            }
            else {
              bVar10 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              uVar16 = (uint)bVar10;
            }
            pEVar31[-1].hard = uVar16;
            lVar29 = -8;
            do {
              uVar12 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              *(uchar *)((long)pEVar31->edge + lVar29) = uVar12;
              lVar29 = lVar29 + 1;
            } while (lVar29 != 0);
            iVar15 = iVar15 + 1;
          } while (iVar15 != (int)local_258);
        }
        if (bVar7) {
          uVar16 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar16 = (uint)uVar13;
        }
        std::vector<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>::reserve
                  (&pOVar34->faces,(ulong)uVar16);
        for (; uVar16 != 0; uVar16 = uVar16 - 1) {
          local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
          std::vector<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>::
          emplace_back<Assimp::NDOImporter::Face>(&pOVar34->faces,(Face *)local_1a8);
          pFVar4 = (pOVar34->faces).
                   super__Vector_base<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (bVar7) {
            uVar17 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
          }
          else {
            uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
            uVar17 = (uint)uVar13;
          }
          pFVar4[-1].elem = uVar17;
        }
        if (bVar7) {
          uVar16 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar16 = (uint)uVar13;
        }
        std::vector<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>::
        reserve(&pOVar34->vertices,(ulong)uVar16);
        for (; uVar16 != 0; uVar16 = uVar16 - 1) {
          local_1a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_1a8._8_8_ = 0;
          __position_00._M_current =
               (pOVar34->vertices).
               super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              (pOVar34->vertices).
              super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>::
            _M_realloc_insert<Assimp::NDOImporter::Vertex>
                      (&pOVar34->vertices,__position_00,(Vertex *)local_1a8);
          }
          else {
            (__position_00._M_current)->num = 0;
            ((__position_00._M_current)->val).x = 0.0;
            ((__position_00._M_current)->val).y = 0.0;
            ((__position_00._M_current)->val).z = 0.0;
            ppVVar2 = &(pOVar34->vertices).
                       super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppVVar2 = *ppVVar2 + 1;
          }
          pVVar5 = (pOVar34->vertices).
                   super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (bVar7) {
            uVar17 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
          }
          else {
            uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
            uVar17 = (uint)uVar13;
          }
          pVVar5[-1].num = uVar17;
          fVar35 = StreamReader<true,_false>::Get<float>(&local_1e0);
          pVVar5[-1].val.x = fVar35;
          fVar35 = StreamReader<true,_false>::Get<float>(&local_1e0);
          pVVar5[-1].val.y = fVar35;
          fVar35 = StreamReader<true,_false>::Get<float>(&local_1e0);
          pVVar5[-1].val.z = fVar35;
        }
        if (bVar7) {
          uVar16 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar16 = (uint)uVar13;
        }
        for (; uVar16 != 0; uVar16 = uVar16 - 1) {
          if (bVar7) {
            StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
          }
          else {
            StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          }
        }
        if (bVar7) {
          uVar16 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar16 = (uint)uVar13;
        }
        for (; uVar16 != 0; uVar16 = uVar16 - 1) {
          if (bVar7) {
            StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
          }
          else {
            StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          }
        }
        uVar12 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
        if (uVar12 != '\0') {
          uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar14 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          if ((uint)uVar14 * (uint)uVar13 != 0) {
            uVar16 = 0;
            do {
              bVar10 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              uVar16 = uVar16 + bVar10;
            } while (uVar16 < (uint)uVar14 * (uint)uVar13);
          }
        }
      }
      local_268 = (aiNode **)(ulong)((int)local_268 + 1);
      ppaVar19 = (aiNode **)(((long)(local_220._8_8_ - local_220._0_8_) >> 3) * 0x4ec4ec4ec4ec4ec5);
    } while (local_268 <= ppaVar19 && (long)ppaVar19 - (long)local_268 != 0);
  }
  paVar20 = (aiNode *)operator_new(0x478);
  local_1a8._0_8_ = &local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"$NDODummyRoot","");
  aiNode::aiNode(paVar20,(string *)local_1a8);
  local_228->mRootNode = paVar20;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
  }
  local_1f8 = (pointer)local_220._8_8_;
  lVar29 = (long)(local_220._8_8_ - local_220._0_8_) >> 3;
  uVar30 = lVar29 * 0x4ec4ec4ec4ec4ec5;
  paVar20->mNumChildren = (uint)uVar30;
  uVar30 = (uVar30 & 0xffffffff) << 3;
  ppaVar19 = (aiNode **)operator_new__(uVar30);
  memset(ppaVar19,0,uVar30);
  paVar20->mChildren = ppaVar19;
  uVar30 = lVar29 * 0x7627627627627628 & 0x7fffffff8;
  __s = (aiMesh **)operator_new__(uVar30);
  memset(__s,0,uVar30);
  local_228->mMeshes = __s;
  local_288.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_288.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_288.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pOVar34 = (pointer)local_220._0_8_;
  if ((pointer)local_220._0_8_ != local_1f8) {
    do {
      local_1f0 = paVar20;
      paVar20 = local_1f0;
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00,&pOVar34->name);
      *ppaVar19 = this_00;
      this_00->mParent = paVar20;
      local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
      local_198._M_allocated_capacity = 0;
      local_198._8_8_ = local_1a8 + 8;
      uStack_180 = 0;
      uStack_17c = 0;
      pEVar31 = (pOVar34->edges).
                super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar6 = (pOVar34->edges).
               super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_268 = ppaVar19;
      local_250 = this_00;
      uStack_188 = (_Rb_tree_node_base *)local_198._8_8_;
      if (pEVar31 != pEVar6) {
        mVar32 = 0;
        do {
          pmVar21 = std::
                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                  *)local_1a8,pEVar31->edge + 2);
          *pmVar21 = mVar32;
          pmVar21 = std::
                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                  *)local_1a8,pEVar31->edge + 3);
          *pmVar21 = mVar32;
          mVar32 = mVar32 + 1;
          pEVar31 = pEVar31 + 1;
        } while (pEVar31 != pEVar6);
      }
      paVar22 = (aiMesh *)operator_new(0x520);
      paVar22->mPrimitiveTypes = 0;
      paVar22->mNumVertices = 0;
      paVar22->mNumFaces = 0;
      local_1e8 = &paVar22->mVertices;
      memset(local_1e8,0,0xcc);
      paVar22->mBones = (aiBone **)0x0;
      paVar22->mMaterialIndex = 0;
      (paVar22->mName).length = 0;
      (paVar22->mName).data[0] = '\0';
      memset((paVar22->mName).data + 1,0x1b,0x3ff);
      uVar16 = uStack_180;
      paVar22->mNumAnimMeshes = 0;
      paVar22->mAnimMeshes = (aiAnimMesh **)0x0;
      paVar22->mMethod = 0;
      (paVar22->mAABB).mMin.x = 0.0;
      (paVar22->mAABB).mMin.y = 0.0;
      (paVar22->mAABB).mMin.z = 0.0;
      (paVar22->mAABB).mMax.x = 0.0;
      (paVar22->mAABB).mMax.y = 0.0;
      (paVar22->mAABB).mMax.z = 0.0;
      paVar22->mTextureCoords[0] = (aiVector3D *)0x0;
      paVar22->mTextureCoords[1] = (aiVector3D *)0x0;
      paVar22->mTextureCoords[2] = (aiVector3D *)0x0;
      paVar22->mTextureCoords[3] = (aiVector3D *)0x0;
      paVar22->mTextureCoords[4] = (aiVector3D *)0x0;
      paVar22->mTextureCoords[5] = (aiVector3D *)0x0;
      paVar22->mTextureCoords[6] = (aiVector3D *)0x0;
      paVar22->mTextureCoords[7] = (aiVector3D *)0x0;
      paVar22->mNumUVComponents[0] = 0;
      paVar22->mNumUVComponents[1] = 0;
      paVar22->mNumUVComponents[2] = 0;
      paVar22->mNumUVComponents[3] = 0;
      paVar22->mNumUVComponents[4] = 0;
      paVar22->mNumUVComponents[5] = 0;
      paVar22->mNumUVComponents[6] = 0;
      paVar22->mNumUVComponents[7] = 0;
      paVar22->mColors[0] = (aiColor4D *)0x0;
      paVar22->mColors[1] = (aiColor4D *)0x0;
      paVar22->mColors[2] = (aiColor4D *)0x0;
      paVar22->mColors[3] = (aiColor4D *)0x0;
      paVar22->mColors[4] = (aiColor4D *)0x0;
      paVar22->mColors[5] = (aiColor4D *)0x0;
      paVar22->mColors[6] = (aiColor4D *)0x0;
      paVar22->mColors[7] = (aiColor4D *)0x0;
      lVar29 = CONCAT44(uStack_17c,uStack_180);
      paVar22->mNumFaces = uStack_180;
      uVar30 = (ulong)uStack_180;
      local_260 = paVar22;
      puVar23 = (ulong *)operator_new__(uVar30 * 0x10 + 8);
      *puVar23 = uVar30;
      paVar33 = (aiFace *)(puVar23 + 1);
      if (uVar16 != 0) {
        paVar24 = paVar33;
        do {
          paVar24->mNumIndices = 0;
          paVar24->mIndices = (uint *)0x0;
          paVar24 = paVar24 + 1;
        } while (paVar24 != paVar33 + uVar30);
      }
      local_260->mFaces = paVar33;
      if (local_288.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_288.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_288.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_288.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                (&local_288,lVar29 << 2);
      uVar26 = local_198._8_8_;
      while (paVar28 = local_288.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
            (_Rb_tree_node_base *)uVar26 != (_Rb_tree_node_base *)(local_1a8 + 8)) {
        if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        local_258 = paVar33 + 1;
        _Var3 = ((_Rb_tree_node_base *)(uVar26 + 0x20))->_M_color;
        uVar16 = *(uint *)&((_Rb_tree_node_base *)(uVar26 + 0x20))->field_0x4;
        do {
          pEVar31 = (pOVar34->edges).
                    super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar30 = (ulong)(_Var3 == pEVar31[uVar16].edge[3]);
          uVar17 = pEVar31[uVar16].edge[uVar30];
          uVar16 = pEVar31[uVar16].edge[uVar30 + 4];
          local_1fc = (int)((ulong)((long)local_288.
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_288.
                                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      -0x55555555;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&local_248,&local_1fc);
          pVVar5 = (pOVar34->vertices).
                   super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          paVar27 = &pVVar5[uVar17].val;
          if (local_288.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_288.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>const&>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_288,
                       (iterator)
                       local_288.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish,paVar27);
          }
          else {
            (local_288.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->z = pVVar5[uVar17].val.z;
            fVar35 = paVar27->y;
            (local_288.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->x = paVar27->x;
            (local_288.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->y = fVar35;
            local_288.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_288.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          puVar8 = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          __src = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        } while (uVar16 != *(uint *)&((_Rb_tree_node_base *)(uVar26 + 0x20))->field_0x4);
        uVar30 = (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        paVar33->mNumIndices = (uint)(uVar30 >> 2);
        puVar25 = (uint *)operator_new__(uVar30 & 0x3fffffffc);
        paVar33->mIndices = puVar25;
        if (puVar8 != __src) {
          memmove(puVar25,__src,uVar30);
        }
        uVar26 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar26);
        paVar33 = local_258;
      }
      local_258 = (aiFace *)
                  local_288.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start;
      __n = (long)local_288.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_288.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start;
      uVar30 = (long)__n / 0xc;
      local_260->mNumVertices = (uint)uVar30;
      uVar30 = uVar30 & 0xffffffff;
      paVar27 = (aiVector3D *)operator_new__(uVar30 * 0xc);
      ppaVar19 = local_268;
      if (uVar30 != 0) {
        memset(paVar27,0,((uVar30 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      *local_1e8 = paVar27;
      if ((aiFace *)paVar28 != local_258) {
        memmove(paVar27,local_258,__n);
      }
      paVar22 = local_260;
      if (local_260->mNumVertices == 0) {
        aiMesh::~aiMesh(local_260);
        operator_delete(paVar22,0x520);
      }
      else {
        local_228->mMeshes[local_228->mNumMeshes] = local_260;
        uVar16 = local_228->mNumMeshes;
        local_228->mNumMeshes = uVar16 + 1;
        local_250->mNumMeshes = 1;
        puVar25 = (uint *)operator_new__(4);
        local_250->mMeshes = puVar25;
        *puVar25 = uVar16;
      }
      ppaVar19 = ppaVar19 + 1;
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)local_1a8);
      pOVar34 = pOVar34 + 1;
      paVar20 = local_1f0;
    } while (pOVar34 != local_1f8);
  }
  if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_288.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
    operator_delete(local_288.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>::~vector
            ((vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_> *)
             local_220);
  StreamReader<true,_false>::~StreamReader(&local_1e0);
  return;
}

Assistant:

void NDOImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderBE reader(pIOHandler->Open( pFile, "rb"));

    // first 9 bytes are nendo file format ("nendo 1.n")
    const char* head = (const char*)reader.GetPtr();
    reader.IncPtr(9);

    if (strncmp("nendo ",head,6)) {
        throw DeadlyImportError("Not a Nendo file; magic signature missing");
    }
    // check if this is a supported version. if not, continue, too -- users,
    // please don't complain if it doesn't work then ...
    unsigned int file_format = 12;
    if (!strncmp("1.0",head+6,3)) {
        file_format = 10;
        ASSIMP_LOG_INFO("NDO file format is 1.0");
    }
    else if (!strncmp("1.1",head+6,3)) {
        file_format = 11;
        ASSIMP_LOG_INFO("NDO file format is 1.1");
    }
    else if (!strncmp("1.2",head+6,3)) {
        file_format = 12;
        ASSIMP_LOG_INFO("NDO file format is 1.2");
    }
    else {
        ASSIMP_LOG_WARN_F( "Unrecognized nendo file format version, continuing happily ... :", (head+6));
    }

    reader.IncPtr(2); /* skip flags */
    if (file_format >= 12) {
        reader.IncPtr(2);
    }
    unsigned int temp = reader.GetU1();

    std::vector<Object> objects(temp); /* buffer to store all the loaded objects in */

    // read all objects
    for (unsigned int o = 0; o < objects.size(); ++o) {

//      if (file_format < 12) {
            if (!reader.GetI1()) {
                continue; /* skip over empty object */
            }
        //  reader.GetI2();
//      }
        Object& obj = objects[o];

        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        head = (const char*)reader.GetPtr();
        reader.IncPtr(temp + 76); /* skip unknown stuff */

        obj.name = std::string(head, temp);

        // read edge table
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        obj.edges.reserve(temp);
        for (unsigned int e = 0; e < temp; ++e) {

            obj.edges.push_back(Edge());
            Edge& edge = obj.edges.back();

            for (unsigned int i = 0; i< 8; ++i) {
                edge.edge[i] = file_format >= 12 ? reader.GetU4() : reader.GetU2();
            }
            edge.hard =  file_format >= 11 ? reader.GetU1() : 0;
            for (unsigned int i = 0; i< 8; ++i) {
                edge.color[i] = reader.GetU1();
            }
        }

        // read face table
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        obj.faces.reserve(temp);
        for (unsigned int e = 0; e < temp; ++e) {

            obj.faces.push_back(Face());
            Face& face = obj.faces.back();

            face.elem = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        }

        // read vertex table
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        obj.vertices.reserve(temp);
        for (unsigned int e = 0; e < temp; ++e) {

            obj.vertices.push_back(Vertex());
            Vertex& v = obj.vertices.back();

            v.num = file_format >= 12 ? reader.GetU4() : reader.GetU2();
            v.val.x = reader.GetF4();
            v.val.y = reader.GetF4();
            v.val.z = reader.GetF4();
        }

        // read UVs
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        for (unsigned int e = 0; e < temp; ++e) {
             file_format >= 12 ? reader.GetU4() : reader.GetU2();
        }

        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        for (unsigned int e = 0; e < temp; ++e) {
             file_format >= 12 ? reader.GetU4() : reader.GetU2();
        }

        if (reader.GetU1()) {
            const unsigned int x = reader.GetU2(), y = reader.GetU2();
            temp = 0;
            while (temp < x*y)  {
                unsigned int repeat = reader.GetU1();
                reader.GetU1();
                reader.GetU1();
                reader.GetU1();
                temp += repeat;
            }
        }
    }

    // construct a dummy node graph and add all named objects as child nodes
    aiNode* root = pScene->mRootNode = new aiNode("$NDODummyRoot");
    aiNode** cc = root->mChildren = new aiNode* [ root->mNumChildren = static_cast<unsigned int>( objects.size()) ] ();
    pScene->mMeshes = new aiMesh* [ root->mNumChildren] ();

    std::vector<aiVector3D> vertices;
    std::vector<unsigned int> indices;

    for(const Object& obj : objects) {
        aiNode* nd = *cc++ = new aiNode(obj.name);
        nd->mParent = root;

        // translated from a python dict() - a vector might be sufficient as well
        typedef std::map<unsigned int, unsigned int>  FaceTable;
        FaceTable face_table;

        unsigned int n = 0;
        for(const Edge& edge : obj.edges) {

            face_table[edge.edge[2]] = n;
            face_table[edge.edge[3]] = n;

            ++n;
        }

        aiMesh* mesh = new aiMesh();
        mesh->mNumFaces=static_cast<unsigned int>(face_table.size());
        aiFace* faces = mesh->mFaces = new aiFace[mesh->mNumFaces];

        vertices.clear();
        vertices.reserve(4 * face_table.size()); // arbitrarily chosen
        for(FaceTable::value_type& v : face_table) {
            indices.clear();

            aiFace& f = *faces++;

            const unsigned int key = v.first;
            unsigned int cur_edge = v.second;
            while (1) {
                unsigned int next_edge, next_vert;
                if (key == obj.edges[cur_edge].edge[3]) {
                    next_edge = obj.edges[cur_edge].edge[5];
                    next_vert = obj.edges[cur_edge].edge[1];
                }
                else {
                    next_edge = obj.edges[cur_edge].edge[4];
                    next_vert = obj.edges[cur_edge].edge[0];
                }
                indices.push_back( static_cast<unsigned int>(vertices.size()) );
                vertices.push_back(obj.vertices[ next_vert ].val);

                cur_edge = next_edge;
                if (cur_edge == v.second) {
                    break;
                }
            }

            f.mIndices = new unsigned int[f.mNumIndices = static_cast<unsigned int>(indices.size())];
            std::copy(indices.begin(),indices.end(),f.mIndices);
        }

        mesh->mVertices = new aiVector3D[mesh->mNumVertices = static_cast<unsigned int>(vertices.size())];
        std::copy(vertices.begin(),vertices.end(),mesh->mVertices);

        if (mesh->mNumVertices) {
            pScene->mMeshes[pScene->mNumMeshes] = mesh;

            (nd->mMeshes = new unsigned int[nd->mNumMeshes=1])[0]=pScene->mNumMeshes++;
        }else
            delete mesh;
    }
}